

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_datablobsources.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  char *__format;
  bool bVar7;
  bool bVar8;
  uint32_t count;
  hrgls_API api;
  hrgls_APICreateParams params;
  char *name;
  hrgls_APIDataBlobSourceInfo dbsInfo;
  int local_60;
  uint local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  iVar2 = hrgls_APICreateParametersCreate(&local_48);
  if (iVar2 == 0) {
    iVar2 = hrgls_APICreate(&local_50,local_48);
    if (iVar2 == 0) {
      iVar2 = hrgls_APICreateParametersDestroy(local_48);
      if (iVar2 == 0) {
        iVar3 = hrgls_APIGetAvailableDataBlobSourceCount(local_50,&local_54);
        if (iVar3 == 0) {
          printf("Found %d DataBlobSources\n",(ulong)local_54);
          bVar7 = local_54 != 0;
          if (local_54 == 0) {
            local_60 = 0;
          }
          else {
            uVar6 = 0;
            local_60 = 0;
            do {
              iVar2 = hrgls_APIGetAvailableDataBlobSourceInfo(local_50,uVar6,&local_38);
              pFVar1 = _stderr;
              if (iVar2 == 0) {
                iVar2 = hrgls_APIDataBlobSourceGetName(local_38,&local_40);
                pFVar1 = _stderr;
                bVar8 = iVar2 == 0;
                if (bVar8) {
                  printf(" DataBlobSource name: %s\n",local_40);
                }
                else {
                  uVar4 = hrgls_ErrorMessage(iVar2);
                  fprintf(pFVar1,"Could not get DataBlobSource name for DataBlobSource %d: %s\n",
                          uVar6,uVar4);
                  local_60 = 0x12e;
                }
              }
              else {
                uVar4 = hrgls_ErrorMessage(iVar2);
                bVar8 = false;
                fprintf(pFVar1,"Could not get DataBlobSource info for DataBlobSource %d: %s\n",uVar6
                        ,uVar4);
                local_60 = 0x12d;
              }
              if (!bVar8) break;
              uVar5 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar5;
              bVar7 = uVar5 < local_54;
            } while (bVar7);
          }
          if (bVar7) {
            return local_60;
          }
          iVar3 = hrgls_APIDestroy(local_50);
          if (iVar3 == 0) {
            return 0;
          }
          iVar2 = 0x14;
          __format = "Could not destroy API with default parameters: %s\n";
        }
        else {
          iVar2 = 3;
          __format = "Could not get number of available DataBlobSources: %s\n";
        }
        pFVar1 = _stderr;
        uVar4 = hrgls_ErrorMessage(iVar3);
        fprintf(pFVar1,__format,uVar4);
      }
      else {
        main_cold_3();
        iVar2 = 1000;
      }
    }
    else {
      main_cold_2();
      iVar2 = 2;
    }
  }
  else {
    main_cold_1();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object, specifying default parameters.
  hrgls_Status status;
  hrgls_APICreateParams params;
  status = hrgls_APICreateParametersCreate(&params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1;
  }

  hrgls_API api;
  status = hrgls_APICreate(&api, params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 2;
  }
  status = hrgls_APICreateParametersDestroy(params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1000;
  }

  // Find out how many DataBlobSources are in the system, which will also latch the data
  // on the DataBlobSources.
  uint32_t count;
  if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceCount(api, &count))) {
    fprintf(stderr, "Could not get number of available DataBlobSources: %s\n",
      hrgls_ErrorMessage(status));
    return 3;
  }
  printf("Found %d DataBlobSources\n", count);

  // Read each DataBlobSource's information.
  for (uint32_t i = 0; i < count; i++) {
    hrgls_APIDataBlobSourceInfo dbsInfo;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceInfo(api, i, &dbsInfo))) {
      fprintf(stderr, "Could not get DataBlobSource info for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 301;
    }

    // Get and print the DataBlobSource name.
    const char *name;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIDataBlobSourceGetName(dbsInfo, &name))) {
      fprintf(stderr, "Could not get DataBlobSource name for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 302;
    }
    printf(" DataBlobSource name: %s\n", name);
  }

  status = hrgls_APIDestroy(api);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 20;
  }

  return 0;
}